

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O0

Rwt_Node_t *
Rwt_ManAddNode(Rwt_Man_t *p,Rwt_Node_t *p0,Rwt_Node_t *p1,int fExor,int Level,int Volume)

{
  int iVar1;
  Rwt_Node_t *pRVar2;
  uint local_50;
  uint local_48;
  uint local_44;
  uint uTruth;
  Rwt_Node_t *pNew;
  int Volume_local;
  int Level_local;
  int fExor_local;
  Rwt_Node_t *p1_local;
  Rwt_Node_t *p0_local;
  Rwt_Man_t *p_local;
  
  p->nConsidered = p->nConsidered + 1;
  if (fExor == 0) {
    iVar1 = Rwt_IsComplement(p0);
    if (iVar1 == 0) {
      pRVar2 = Rwt_Regular(p0);
      local_48 = *(uint *)&pRVar2->field_0x8 & 0xffff;
    }
    else {
      pRVar2 = Rwt_Regular(p0);
      local_48 = *(uint *)&pRVar2->field_0x8 & 0xffff ^ 0xffffffff;
    }
    iVar1 = Rwt_IsComplement(p1);
    if (iVar1 == 0) {
      pRVar2 = Rwt_Regular(p1);
      local_50 = *(uint *)&pRVar2->field_0x8 & 0xffff;
    }
    else {
      pRVar2 = Rwt_Regular(p1);
      local_50 = *(uint *)&pRVar2->field_0x8 & 0xffff ^ 0xffffffff;
    }
    local_44 = local_48 & local_50 & 0xffff;
  }
  else {
    local_44 = *(uint *)&p0->field_0x8 & 0xffff ^ *(uint *)&p1->field_0x8 & 0xffff;
  }
  pRVar2 = (Rwt_Node_t *)Mem_FixedEntryFetch(p->pMmNode);
  pRVar2->Id = p->vForest->nSize;
  pRVar2->TravId = 0;
  *(uint *)&pRVar2->field_0x8 = *(uint *)&pRVar2->field_0x8 & 0xffff0000 | local_44;
  *(uint *)&pRVar2->field_0x8 = *(uint *)&pRVar2->field_0x8 & 0xc0ffffff | (Level & 0x3fU) << 0x18;
  *(uint *)&pRVar2->field_0x8 = *(uint *)&pRVar2->field_0x8 & 0xff00ffff | (Volume & 0xffU) << 0x10;
  *(uint *)&pRVar2->field_0x8 = *(uint *)&pRVar2->field_0x8 & 0xbfffffff;
  *(uint *)&pRVar2->field_0x8 = *(uint *)&pRVar2->field_0x8 & 0x7fffffff | fExor << 0x1f;
  pRVar2->p0 = p0;
  pRVar2->p1 = p1;
  pRVar2->pNext = (Rwt_Node_t *)0x0;
  Vec_PtrPush(p->vForest,pRVar2);
  if (local_44 == p->puCanons[local_44]) {
    p->nAdded = p->nAdded + 1;
    if (p->pTable[local_44] == (Rwt_Node_t *)0x0) {
      p->nClasses = p->nClasses + 1;
    }
    Rwt_ListAddToTail(p->pTable + local_44,pRVar2);
  }
  return pRVar2;
}

Assistant:

Rwt_Node_t * Rwt_ManAddNode( Rwt_Man_t * p, Rwt_Node_t * p0, Rwt_Node_t * p1, int fExor, int Level, int Volume )
{
    Rwt_Node_t * pNew;
    unsigned uTruth;
    // compute truth table, leve, volume
    p->nConsidered++;
    if ( fExor )
        uTruth = (p0->uTruth ^ p1->uTruth);
    else
        uTruth = (Rwt_IsComplement(p0)? ~Rwt_Regular(p0)->uTruth : Rwt_Regular(p0)->uTruth) &
                 (Rwt_IsComplement(p1)? ~Rwt_Regular(p1)->uTruth : Rwt_Regular(p1)->uTruth) & 0xFFFF;
    // create the new node
    pNew = (Rwt_Node_t *)Mem_FixedEntryFetch( p->pMmNode );
    pNew->Id     = p->vForest->nSize;
    pNew->TravId = 0;
    pNew->uTruth = uTruth;
    pNew->Level  = Level;
    pNew->Volume = Volume;
    pNew->fUsed  = 0;
    pNew->fExor  = fExor;
    pNew->p0     = p0;
    pNew->p1     = p1;
    pNew->pNext  = NULL;
    Vec_PtrPush( p->vForest, pNew );
    // do not add if the node is not essential
    if ( uTruth != p->puCanons[uTruth] )
        return pNew;

    // add to the list
    p->nAdded++;
    if ( p->pTable[uTruth] == NULL )
        p->nClasses++;
    Rwt_ListAddToTail( p->pTable + uTruth, pNew );
    return pNew;
}